

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::InsertInclude(cmTarget *this,string *entry,cmListFileBacktrace *bt,bool before)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  const_iterator __position;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  __position._M_current =
       *(cmListFileBacktrace **)
        ((long)&(_Var1._M_head_impl)->IncludeDirectoriesBacktraces + (ulong)!before * 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&(_Var1._M_head_impl)->IncludeDirectoriesEntries,
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)&(_Var1._M_head_impl)->IncludeDirectoriesEntries + (ulong)!before * 8),entry);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::insert
            (&((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
              IncludeDirectoriesBacktraces,__position,bt);
  return;
}

Assistant:

void cmTarget::InsertInclude(std::string const& entry,
                             cmListFileBacktrace const& bt, bool before)
{
  std::vector<std::string>::iterator position = before
    ? impl->IncludeDirectoriesEntries.begin()
    : impl->IncludeDirectoriesEntries.end();

  std::vector<cmListFileBacktrace>::iterator btPosition = before
    ? impl->IncludeDirectoriesBacktraces.begin()
    : impl->IncludeDirectoriesBacktraces.end();

  impl->IncludeDirectoriesEntries.insert(position, entry);
  impl->IncludeDirectoriesBacktraces.insert(btPosition, bt);
}